

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

int __thiscall
fmp4_stream::ingest_stream::load_from_file(ingest_stream *this,istream *infile,bool init_only)

{
  string *psVar1;
  char *pcVar2;
  pointer ptr;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  ssize_t sVar6;
  ostream *poVar7;
  size_t in_RCX;
  void *__buf;
  long lVar8;
  ulong uVar9;
  pointer pbVar10;
  uint data_size;
  uint8_t name [9];
  vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_> ingest_boxes;
  string enc_box_name;
  string local_5b8;
  string local_598;
  exception e;
  char local_560 [80];
  box local_510;
  vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_> vStack_4a8;
  bool local_490;
  box local_488;
  box local_420;
  _func_int **local_3b8;
  undefined8 uStack_3b0;
  uint32_t local_3a8;
  mfhd local_3a0;
  tfhd local_330;
  tfdt local_2a0;
  trun local_228;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  emsg e_1;
  
  if (((byte)infile[*(long *)(*(long *)infile + -0x18) + 0x20] & 5) == 0) {
    ingest_boxes.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ingest_boxes.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ingest_boxes.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    do {
      if (*(int *)(infile + *(long *)(*(long *)infile + -0x18) + 0x20) != 0) break;
      box::box((box *)&e);
      sVar6 = box::read((box *)&e,(int)infile,__buf,in_RCX);
      if ((char)sVar6 == '\0') {
        box::~box((box *)&e);
        break;
      }
      std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::push_back
                (&ingest_boxes,(box *)&e);
      iVar5 = std::__cxx11::string::compare(local_560);
      box::~box((box *)&e);
    } while (iVar5 != 0);
    pbVar10 = ingest_boxes.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
              _M_impl.super__Vector_impl_data._M_start;
    while( true ) {
      if (pbVar10 ==
          ingest_boxes.super__Vector_base<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>.
          _M_impl.super__Vector_impl_data._M_finish) break;
      pcVar2 = (pbVar10->box_type_)._M_dataplus._M_p;
      std::__cxx11::string::string((string *)&local_598,"ftyp",(allocator *)&e);
      bVar4 = f_compare_4cc(pcVar2,&local_598);
      std::__cxx11::string::~string((string *)&local_598);
      if (bVar4) {
        box::operator=((box *)this,pbVar10);
      }
      pcVar2 = (pbVar10->box_type_)._M_dataplus._M_p;
      std::__cxx11::string::string((string *)&local_130,"moov",(allocator *)&e);
      bVar4 = f_compare_4cc(pcVar2,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      if ((bVar4) && (box::operator=(&(this->init_fragment_).moov_box_,pbVar10), init_only)) {
        std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&ingest_boxes);
        return 0;
      }
      pcVar2 = (pbVar10->box_type_)._M_dataplus._M_p;
      std::__cxx11::string::string((string *)&local_150,"moof",(allocator *)&e);
      bVar4 = f_compare_4cc(pcVar2,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      if (bVar4) {
        box::box((box *)&e);
        box::box(&local_510);
        vStack_4a8.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_490 = false;
        vStack_4a8.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_4a8.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl
        .super__Vector_impl_data._M_finish._0_1_ = 0;
        vStack_4a8.super__Vector_base<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>._M_impl
        .super__Vector_impl_data._M_finish._1_7_ = 0;
        box::box(&local_488);
        box::box(&local_420);
        local_3b8 = (_func_int **)0x0;
        uStack_3b0._0_4_ = 0;
        uStack_3b0._4_4_ = 0;
        local_3a8 = 0;
        mfhd::mfhd(&local_3a0);
        tfhd::tfhd(&local_330);
        tfdt::tfdt(&local_2a0);
        trun::trun(&local_228);
        box::operator=(&local_488,pbVar10);
        init_fragment::get_trex((trex *)&e_1,&this->init_fragment_);
        local_3a8 = (uint32_t)e_1.super_full_box.super_box.large_size_;
        local_3b8 = e_1.super_full_box.super_box._vptr_box;
        uStack_3b0._0_4_ = e_1.super_full_box.super_box.size_;
        uStack_3b0._4_4_ = e_1.super_full_box.super_box._12_4_;
        iVar5 = std::__cxx11::string::compare((char *)&pbVar10[-1].box_type_);
        if (iVar5 == 0) {
          emsg::emsg(&e_1);
          ptr = pbVar10[-1].box_data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
          emsg::parse(&e_1,(char *)ptr,
                      *(int *)&pbVar10[-1].box_data_.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (int)ptr);
          std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::push_back
                    (&vStack_4a8,&e_1);
          emsg::~emsg(&e_1);
        }
        do {
          pcVar2 = pbVar10[1].box_type_._M_dataplus._M_p;
          std::__cxx11::string::string((string *)&local_5b8,"mdat",(allocator *)&e_1);
          pbVar10 = pbVar10 + 1;
          bVar4 = f_compare_4cc(pcVar2,&local_5b8);
          std::__cxx11::string::~string((string *)&local_5b8);
        } while (!bVar4);
        box::operator=(&local_420,pbVar10);
        media_fragment::parse_moof((media_fragment *)&e);
        uVar9 = 8;
        do {
          if ((ulong)((long)local_420.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_420.box_data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) <= uVar9) break;
          name[0] = '\0';
          name[1] = '\0';
          name[2] = '\0';
          name[3] = '\0';
          name[4] = '\0';
          name[5] = '\0';
          name[6] = '\0';
          name[7] = '\0';
          for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
            name[lVar8] = local_420.box_data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[(uint)((int)lVar8 + (int)uVar9)];
          }
          name[8] = '\0';
          data_size = (uint)name._0_4_ >> 0x18 | (name._0_4_ & 0xff0000) >> 8 |
                      (name._0_4_ & 0xff00) << 8 | name._0_4_ << 0x18;
          if ((ulong)((long)local_420.box_data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_420.box_data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start) < (ulong)data_size) break;
          std::__cxx11::string::string((string *)&enc_box_name,(char *)(name + 4),(allocator *)&e_1)
          ;
          _Var3 = enc_box_name._M_dataplus;
          std::__cxx11::string::string((string *)&local_170,"emsg",(allocator *)&e_1);
          bVar4 = f_compare_4cc(_Var3._M_p,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          _Var3 = enc_box_name._M_dataplus;
          if (bVar4) {
            emsg::emsg(&e_1);
            emsg::parse(&e_1,(char *)(local_420.box_data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar9),data_size);
            std::vector<fmp4_stream::emsg,_std::allocator<fmp4_stream::emsg>_>::push_back
                      (&vStack_4a8,&e_1);
            local_490 = true;
            emsg::~emsg(&e_1);
            bVar4 = false;
          }
          else {
            std::__cxx11::string::string((string *)&local_190,"embe",(allocator *)&e_1);
            bVar4 = f_compare_4cc(_Var3._M_p,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            if (!bVar4) {
              data_size = 0;
            }
            bVar4 = !bVar4;
          }
          uVar9 = (ulong)((int)uVar9 + data_size);
          std::__cxx11::string::~string((string *)&enc_box_name);
        } while (!bVar4);
        std::vector<fmp4_stream::media_fragment,_std::allocator<fmp4_stream::media_fragment>_>::
        push_back(&this->media_fragment_,(media_fragment *)&e);
        media_fragment::~media_fragment((media_fragment *)&e);
      }
      psVar1 = &pbVar10->box_type_;
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
        box::operator=(&this->mfra_box_,pbVar10);
      }
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
        box::operator=(&this->sidx_box_,pbVar10);
        std::operator<<((ostream *)&std::cout,"|sidx|");
      }
      iVar5 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar5 == 0) {
        box::operator=(&this->meta_box_,pbVar10);
        std::operator<<((ostream *)&std::cout,"|meta|");
      }
      pbVar10 = pbVar10 + 1;
    }
    std::vector<fmp4_stream::box,_std::allocator<fmp4_stream::box>_>::~vector(&ingest_boxes);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar7 = std::operator<<((ostream *)&std::cout,"***  finished reading fmp4 fragments  ***");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"***  read  fmp4 init fragment         ***");
  std::endl<char,std::char_traits<char>>(poVar7);
  poVar7 = std::operator<<((ostream *)&std::cout,"***  read ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7," fmp4 media fragments ***");
  std::endl<char,std::char_traits<char>>(poVar7);
  return 0;
}

Assistant:

int ingest_stream::load_from_file(std::istream &infile, bool init_only)
	{
		try
		{
			if (infile)
			{
				std::vector<box> ingest_boxes;

				while (infile.good()) // read box by box in a vector
				{
					box b = {};
					if (b.read(infile))
						ingest_boxes.push_back(b);
					else  // break when we have boxes of size zero
						break;

					if (b.box_type_.compare("mfra") == 0)
						break;
				}

				// organize the boxes in init fragments and media fragments 
				for (auto it = ingest_boxes.begin(); it != ingest_boxes.end(); ++it)
				{
					if (f_compare_4cc( (char *)it->box_type_.c_str(), "ftyp"))
						init_fragment_.ftyp_box_ = *it;
					if (f_compare_4cc((char*)it->box_type_.c_str(), "moov"))
					{
						init_fragment_.moov_box_ = *it;
						
						if (init_only)
							return 0;
					}

					if (f_compare_4cc((char*)it->box_type_.c_str(), "moof")) // in case of moof box we push both the moof and following mdat
					{
						media_fragment m = {};
						m.moof_box_ = *it;
						m.trex_ = init_fragment_.get_trex();
						bool mdat_found = false;
						auto prev_box = (it - 1);
						// see if there is an emsg before
						if (prev_box->box_type_.compare("emsg") == 0)
						{
							emsg e;
							e.parse((char *)& prev_box->box_data_[0], (unsigned int)prev_box->box_data_.size());
							m.emsg_.push_back(e);
							//cout << "|emsg|";
							//std::cout << "found inband dash emsg box" << std::endl;
						}
						//cout << "|moof|";
						while (!mdat_found)
						{
							it++;

							if (f_compare_4cc((char*)it->box_type_.c_str(), "mdat"))
							{
								// find event messages embedded in 

								m.mdat_box_ = *it;
								mdat_found = true;
								m.parse_moof();

								uint32_t index = 8;

								while (index < m.mdat_box_.box_data_.size())
								{
									// seek to next box in 
									uint8_t name[9] = {};
									for (uint32_t i = 0; i < 8; i++)
										name[i] = m.mdat_box_.box_data_[index + i];
									name[8] = '\0';
									uint32_t l_size = fmp4_read_uint32((char *)name);

									if (l_size > m.mdat_box_.box_data_.size())
										break;

									std::string enc_box_name((char *)&name[4]);

									if (f_compare_4cc((char*)enc_box_name.c_str(), "emsg") ) // right now we can only parse a single emsg, todo update to parse multiple emsg
									{
										emsg e = {};
										e.parse((char *)&m.mdat_box_.box_data_[index], (unsigned int)l_size);
										m.emsg_.push_back(e);
										m.e_msg_is_in_mdat_ = true;
										index += l_size;
										continue;
									}
									if (f_compare_4cc((char*)enc_box_name.c_str(), "embe"))
									{
										index += l_size;
										continue;
									}
									break; // skip on all other mdat content only embe and emsg allowed
								}

								media_fragment_.push_back(m);

								break;
							}
						}
					}
					if (it->box_type_.compare("mfra") == 0)
					{
						this->mfra_box_ = *it;
					}
					if (it->box_type_.compare("sidx") == 0)
					{
						this->sidx_box_ = *it;
						std::cout << "|sidx|";
					}
					if (it->box_type_.compare("meta") == 0)
					{
						this->meta_box_ = *it;
						std::cout << "|meta|";
					}
				}
			}
			std::cout << std::endl;
			std::cout << "***  finished reading fmp4 fragments  ***" << std::endl;
			std::cout << "***  read  fmp4 init fragment         ***" << std::endl;
			std::cout << "***  read " << media_fragment_.size() << " fmp4 media fragments ***" << std::endl;

			return 0;
		}
		catch (std::exception e)
		{
			std::cout << e.what() << std::endl;
			return 0;
		}
	}